

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O1

float If_CutEdgeFlow(If_Man_t *p,If_Cut_t *pCut)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  uVar2 = *(uint *)&pCut->field_0x1c >> 0x18;
  fVar4 = (float)uVar2;
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    uVar3 = 0;
    do {
      fVar5 = (&pCut[1].Area)[uVar3];
      if (((long)(int)fVar5 < 0) || (p->vObjs->nSize <= (int)fVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (uint *)p->vObjs->pArray[(int)fVar5];
      if (puVar1 == (uint *)0x0) {
        return fVar4;
      }
      if ((puVar1[3] == 0) || ((*puVar1 & 0xf) == 1)) {
        fVar5 = (float)puVar1[0x15];
      }
      else {
        fVar5 = (float)puVar1[0xc];
        if (fVar5 < p->fEpsilon || fVar5 == p->fEpsilon) {
          __assert_fail("pLeaf->EstRefs > p->fEpsilon",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifCut.c"
                        ,0x3c1,"float If_CutEdgeFlow(If_Man_t *, If_Cut_t *)");
        }
        fVar5 = (float)puVar1[0x15] / fVar5;
      }
      fVar4 = fVar4 + fVar5;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return fVar4;
}

Assistant:

float If_CutEdgeFlow( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    float Flow;
    int i;
    Flow = pCut->nLeaves;
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        if ( pLeaf->nRefs == 0 || If_ObjIsConst1(pLeaf) )
            Flow += If_ObjCutBest(pLeaf)->Edge;
        else 
        {
            assert( pLeaf->EstRefs > p->fEpsilon );
            Flow += If_ObjCutBest(pLeaf)->Edge / pLeaf->EstRefs;
        }
    }
    return Flow;
}